

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cxx
# Opt level: O2

DisplayAction *
setUsedDimensions(DisplayAction *__return_storage_ptr__,
                 vector<unsigned_int,_std::allocator<unsigned_int>_> *dimensions)

{
  offset_in_Display_to_subr in_R9;
  uint uVar1;
  string local_1d0;
  stringstream s;
  ostream local_1a0;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&s);
  for (uVar1 = 0; (ulong)uVar1 < (ulong)(*(long *)(dimensions + 8) - *(long *)dimensions >> 2);
      uVar1 = uVar1 + 1) {
    if ((ulong)uVar1 != 0) {
      std::operator<<(&local_1a0,':');
    }
    std::ostream::_M_insert<unsigned_long>((ulong)&local_1a0);
  }
  std::__cxx11::stringbuf::str();
  DisplayAction::DisplayAction(__return_storage_ptr__,0,&local_1d0,0,0,in_R9);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&s);
  return __return_storage_ptr__;
}

Assistant:

DisplayAction setUsedDimensions( const vector<uint> &dimensions)
{
	stringstream s;
	for (uint i=0; i<dimensions.size(); ++i) {
		if (i) s << ':';
		s << dimensions[i];
	}
	return DisplayAction(0, s.str(), 0, 0, &Display::setUsedDimensions);
}